

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O3

void tinyformat::detail::formatImpl(ostream *out,char *fmt,FormatArg *args,int numArgs)

{
  ostream *poVar1;
  FormatArg *pFVar2;
  uint *puVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  runtime_error *this;
  size_type sVar7;
  size_type sVar8;
  char *fmtStart;
  bool positionalMode;
  ostream local_1f6;
  bool spacePadPositive;
  int argIndex;
  int ntrunc;
  undefined4 local_1ec;
  FormatArg *local_1e8;
  string result;
  ostringstream tmpStream;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  lVar4 = *(long *)(*(long *)out + -0x18);
  poVar1 = out + lVar4;
  uVar5 = *(undefined8 *)(out + lVar4 + 8);
  uVar6 = *(undefined8 *)(out + lVar4 + 0x10);
  local_1ec = *(undefined4 *)(out + lVar4 + 0x18);
  if (out[lVar4 + 0xe1] == (ostream)0x1) {
    local_1f6 = poVar1[0xe0];
  }
  else {
    local_1f6 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = local_1f6;
    poVar1[0xe1] = (ostream)0x1;
  }
  positionalMode = false;
  argIndex = 0;
  fmtStart = fmt;
  local_1e8 = args;
  do {
    for (; *fmtStart == '%'; fmtStart = fmtStart + 1) {
      std::ostream::write((char *)out,(long)fmt);
      if (fmtStart[1] != '%') goto LAB_0010f052;
      fmtStart = fmtStart + 1;
      fmt = fmtStart;
LAB_0010f04d:
    }
    if (*fmtStart != '\0') goto LAB_0010f04d;
    std::ostream::write((char *)out,(long)fmt);
LAB_0010f052:
    if (*fmtStart == '\0') {
      if ((positionalMode != false) || (numArgs <= argIndex)) {
        lVar4 = *(long *)out;
        *(undefined8 *)(out + *(long *)(lVar4 + -0x18) + 0x10) = uVar6;
        *(undefined8 *)(out + *(long *)(lVar4 + -0x18) + 8) = uVar5;
        *(undefined4 *)(out + *(long *)(lVar4 + -0x18) + 0x18) = local_1ec;
        poVar1 = out + *(long *)(lVar4 + -0x18);
        if (out[*(long *)(lVar4 + -0x18) + 0xe1] == (ostream)0x0) {
          std::ios::widen((char)poVar1);
          poVar1[0xe1] = (ostream)0x1;
        }
        poVar1[0xe0] = local_1f6;
        return;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,"tinyformat: Not enough conversion specifiers in format string");
      goto LAB_0010f26e;
    }
    spacePadPositive = false;
    ntrunc = -1;
    fmt = streamStateFromFormat
                    (out,&positionalMode,&spacePadPositive,&ntrunc,fmtStart,args,&argIndex,numArgs);
    if (numArgs <= argIndex) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this,"tinyformat: Too many conversion specifiers in format string");
LAB_0010f26e:
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pFVar2 = args + argIndex;
    if (spacePadPositive == false) {
      (*pFVar2->m_formatImpl)(out,fmtStart,fmt,ntrunc,pFVar2->m_value);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&tmpStream);
      std::ios::copyfmt((ios *)((ostringstream *)&tmpStream + *(long *)(_tmpStream + -0x18)));
      puVar3 = (uint *)((long)auStack_190 + *(long *)(_tmpStream + -0x18));
      *puVar3 = *puVar3 | 0x800;
      (*pFVar2->m_formatImpl)((ostream *)&tmpStream,fmtStart,fmt,ntrunc,pFVar2->m_value);
      std::__cxx11::stringbuf::str();
      args = local_1e8;
      if (result._M_string_length == 0) {
        sVar8 = 0;
      }
      else {
        sVar7 = 0;
        do {
          if (result._M_dataplus._M_p[sVar7] == '+') {
            result._M_dataplus._M_p[sVar7] = ' ';
          }
          sVar7 = sVar7 + 1;
          sVar8 = result._M_string_length;
        } while (result._M_string_length != sVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,result._M_dataplus._M_p,sVar8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p != &result.field_2) {
        operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tmpStream);
      std::ios_base::~ios_base(local_138);
    }
    fmtStart = fmt;
    if (positionalMode == false) {
      argIndex = argIndex + 1;
    }
  } while( true );
}

Assistant:

inline void formatImpl(std::ostream& out, const char* fmt,
                       const detail::FormatArg* args,
                       int numArgs)
{
    // Saved stream state
    std::streamsize origWidth = out.width();
    std::streamsize origPrecision = out.precision();
    std::ios::fmtflags origFlags = out.flags();
    char origFill = out.fill();

    // "Positional mode" means all format specs should be of the form "%n$..."
    // with `n` an integer. We detect this in `streamStateFromFormat`.
    bool positionalMode = false;
    int argIndex = 0;
    while (true) {
        fmt = printFormatStringLiteral(out, fmt);
        if (*fmt == '\0') {
            if (!positionalMode && argIndex < numArgs) {
                TINYFORMAT_ERROR("tinyformat: Not enough conversion specifiers in format string");
            }
            break;
        }
        bool spacePadPositive = false;
        int ntrunc = -1;
        const char* fmtEnd = streamStateFromFormat(out, positionalMode, spacePadPositive, ntrunc, fmt,
                                                   args, argIndex, numArgs);
        // NB: argIndex may be incremented by reading variable width/precision
        // in `streamStateFromFormat`, so do the bounds check here.
        if (argIndex >= numArgs) {
            TINYFORMAT_ERROR("tinyformat: Too many conversion specifiers in format string");
            return;
        }
        const FormatArg& arg = args[argIndex];
        // Format the arg into the stream.
        if (!spacePadPositive) {
            arg.format(out, fmt, fmtEnd, ntrunc);
        }
        else {
            // The following is a special case with no direct correspondence
            // between stream formatting and the printf() behaviour.  Simulate
            // it crudely by formatting into a temporary string stream and
            // munging the resulting string.
            std::ostringstream tmpStream;
            tmpStream.copyfmt(out);
            tmpStream.setf(std::ios::showpos);
            arg.format(tmpStream, fmt, fmtEnd, ntrunc);
            std::string result = tmpStream.str(); // allocates... yuck.
            for (size_t i = 0, iend = result.size(); i < iend; ++i) {
                if (result[i] == '+')
                    result[i] = ' ';
            }
            out << result;
        }
        if (!positionalMode)
            ++argIndex;
        fmt = fmtEnd;
    }

    // Restore stream state
    out.width(origWidth);
    out.precision(origPrecision);
    out.flags(origFlags);
    out.fill(origFill);
}